

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.hpp
# Opt level: O3

void __thiscall
foxxll::disk_block_allocator::disk_block_allocator
          (disk_block_allocator *this,file *storage,disk_config *cfg)

{
  _Rb_tree_header *p_Var1;
  uint64_t extend_bytes;
  
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  p_Var1 = &(this->free_space_)._M_t._M_impl.super__Rb_tree_header;
  (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->free_bytes_ = 0;
  this->disk_bytes_ = 0;
  extend_bytes = cfg->size;
  this->cfg_bytes_ = extend_bytes;
  this->storage_ = storage;
  this->autogrow_ = cfg->autogrow;
  grow_file(this,extend_bytes);
  return;
}

Assistant:

disk_block_allocator(file* storage, const disk_config& cfg)
        : cfg_bytes_(cfg.size),
          storage_(storage),
          autogrow_(cfg.autogrow)
    {
        // initial growth to configured file size
        grow_file(cfg.size);
    }